

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsPendulum_dns.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  void *returnvalue;
  char *funcname;
  SUNLinearSolver LS;
  SUNMatrix A;
  N_Vector yref;
  sunrealtype *yy0data;
  N_Vector yy0;
  void *cvode_mem;
  int projerr;
  sunrealtype tf;
  sunrealtype atol;
  sunrealtype rtol;
  int nout;
  int retval;
  int i;
  undefined4 in_stack_00000074;
  sunrealtype in_stack_00000078;
  N_Vector in_stack_000000a0;
  int in_stack_000000ac;
  int in_stack_000000b0;
  int in_stack_000000b4;
  sunrealtype in_stack_000000b8;
  sunrealtype in_stack_000000c0;
  sunrealtype in_stack_000000c8;
  N_Vector in_stack_000000d0;
  void *in_stack_000000d8;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 *puVar6;
  int *nout_00;
  sunrealtype *tf_00;
  sunrealtype *atol_00;
  sunrealtype *rtol_00;
  char ***argv_00;
  int *argc_00;
  undefined4 local_3c;
  undefined8 local_38;
  int *projerr_00;
  double local_28;
  int local_14;
  int local_4;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  local_28 = 1e-05;
  projerr_00 = (int *)0x3ee4f8b588e368f1;
  local_38 = 0x403e000000000000;
  local_3c = 1;
  argc_00 = (int *)0x0;
  argv_00 = (char ***)0x0;
  rtol_00 = (sunrealtype *)0x0;
  atol_00 = (sunrealtype *)0x0;
  tf_00 = (sunrealtype *)0x0;
  nout_00 = (int *)0x0;
  SUNContext_Create(0,&sunctx);
  iVar1 = check_retval(tf_00,(char *)nout_00,iVar1);
  if (iVar1 == 0) {
    puVar6 = &local_3c;
    ReadInputs(argc_00,argv_00,rtol_00,atol_00,tf_00,nout_00,projerr_00);
    iVar1 = check_retval(tf_00,(char *)nout_00,(int)((ulong)puVar6 >> 0x20));
    if (iVar1 == 0) {
      uVar2 = N_VNew_Serial(4,sunctx);
      RefSol(in_stack_00000078,(N_Vector)CONCAT44(in_stack_00000074,argc),argv._4_4_);
      iVar1 = check_retval(tf_00,(char *)nout_00,(int)((ulong)puVar6 >> 0x20));
      if (iVar1 == 0) {
        uVar3 = N_VNew_Serial(4,sunctx);
        iVar1 = check_retval(tf_00,(char *)nout_00,(int)((ulong)puVar6 >> 0x20));
        if (iVar1 == 0) {
          puVar4 = (undefined8 *)N_VGetArrayPointer(uVar3);
          *puVar4 = 0x3ff0000000000000;
          puVar4[1] = 0;
          puVar4[2] = 0;
          puVar4[3] = 0;
          uVar5 = CVodeCreate(2,sunctx);
          iVar1 = check_retval(tf_00,(char *)nout_00,(int)((ulong)puVar6 >> 0x20));
          if (iVar1 == 0) {
            CVodeInit(0,uVar5,f,uVar3);
            iVar1 = check_retval(tf_00,(char *)nout_00,(int)((ulong)puVar6 >> 0x20));
            if (iVar1 == 0) {
              returnvalue = (void *)SUNDenseMatrix(4,4,sunctx);
              iVar1 = check_retval(returnvalue,(char *)nout_00,(int)((ulong)puVar6 >> 0x20));
              if (iVar1 == 0) {
                funcname = (char *)SUNLinSol_Dense(uVar3,returnvalue,sunctx);
                iVar1 = check_retval(returnvalue,funcname,(int)((ulong)puVar6 >> 0x20));
                if (iVar1 == 0) {
                  CVodeSetLinearSolver(uVar5,funcname,returnvalue);
                  iVar1 = check_retval(returnvalue,funcname,(int)((ulong)puVar6 >> 0x20));
                  if (iVar1 == 0) {
                    CVodeSetProjFn(uVar5,proj);
                    iVar1 = check_retval(returnvalue,funcname,(int)((ulong)puVar6 >> 0x20));
                    if (iVar1 == 0) {
                      CVodeSetMaxNumSteps(uVar5,50000);
                      iVar1 = check_retval(returnvalue,funcname,(int)((ulong)puVar6 >> 0x20));
                      if (iVar1 == 0) {
                        for (local_14 = 0; local_14 < 5; local_14 = local_14 + 1) {
                          printf("\n\nrtol = %8.2e, atol = %8.2e\n",local_28,projerr_00);
                          printf("Project    x         y");
                          printf("         x\'        y\'     |     g      |    ");
                          printf("nst     rhs eval    setups (J eval)  |   cf   ef\n");
                          GetSol(in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,
                                 in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,
                                 in_stack_000000b0,in_stack_000000ac,in_stack_000000a0);
                          iVar1 = check_retval(returnvalue,funcname,(int)((ulong)puVar6 >> 0x20));
                          if (iVar1 != 0) {
                            return 1;
                          }
                          GetSol(in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,
                                 in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,
                                 in_stack_000000b0,in_stack_000000ac,in_stack_000000a0);
                          iVar1 = check_retval(returnvalue,funcname,(int)((ulong)puVar6 >> 0x20));
                          if (iVar1 != 0) {
                            return 1;
                          }
                          local_28 = local_28 / 10.0;
                          projerr_00 = (int *)((double)projerr_00 / 10.0);
                        }
                        N_VDestroy_Serial(uVar2);
                        N_VDestroy_Serial(uVar3);
                        SUNMatDestroy(returnvalue);
                        SUNLinSolFree(funcname);
                        CVodeFree(&stack0xffffffffffffffb8);
                        SUNContext_Free(&sunctx);
                        local_4 = 0;
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
  int i;
  int retval;                                  /* reusable return flag    */
  int nout               = 1;                  /* number of outputs       */
  sunrealtype rtol       = SUN_RCONST(1.0e-5); /* base relative tolerance */
  sunrealtype atol       = SUN_RCONST(1.0e-5); /* base absolute tolerance */
  sunrealtype tf         = SUN_RCONST(30.0);   /* final integration time  */
  sunbooleantype projerr = SUNTRUE;            /* enable error projection */

  void* cvode_mem      = NULL; /* CVODES memory             */
  N_Vector yy0         = NULL; /* initial condition vector  */
  sunrealtype* yy0data = NULL; /* vector data               */
  N_Vector yref        = NULL; /* reference solution vector */
  SUNMatrix A          = NULL; /* Jacobian matrix           */
  SUNLinearSolver LS   = NULL; /* linear solver             */

  /* Create the SUNDIALS context */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Read command line inputs */
  retval = ReadInputs(&argc, &argv, &rtol, &atol, &tf, &nout, &projerr);
  if (check_retval(&retval, "ReadInputs", 1)) { return (1); }

  /* Compute reference solution */
  yref = N_VNew_Serial(4, sunctx);

  retval = RefSol(tf, yref, nout);
  if (check_retval(&retval, "RefSol", 1)) { return (1); }

  /* Create serial vector to store the initial condition */
  yy0 = N_VNew_Serial(4, sunctx);
  if (check_retval((void*)yy0, "N_VNew_Serial", 0)) { return (1); }

  /* Set the initial condition values */
  yy0data = N_VGetArrayPointer(yy0);

  yy0data[0] = ONE;  /* x  */
  yy0data[1] = ZERO; /* y  */
  yy0data[2] = ZERO; /* xd */
  yy0data[3] = ZERO; /* yd */

  /* Create CVODES memory */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Initialize CVODES */
  retval = CVodeInit(cvode_mem, f, ZERO, yy0);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(4, 4, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy0, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver to CVODES */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  /* Set a user-supplied projection function */
  retval = CVodeSetProjFn(cvode_mem, proj);
  if (check_retval(&retval, "CVodeSetProjFn", 1)) { return (1); }

  /* Set maximum number of steps between outputs */
  retval = CVodeSetMaxNumSteps(cvode_mem, 50000);
  if (check_retval(&retval, "CVodeSetMaxNumSteps", 1)) { return (1); }

  /* Compute the solution with various tolerances */
  for (i = 0; i < 5; i++)
  {
    /* Output tolerance and output header for this run */
    printf("\n\nrtol = %8.2" ESYM ", atol = %8.2" ESYM "\n", rtol, atol);
    printf("Project    x         y");
    printf("         x'        y'     |     g      |    ");
    printf("nst     rhs eval    setups (J eval)  |   cf   ef\n");

    /* Compute solution with projection */
    retval = GetSol(cvode_mem, yy0, rtol, atol, tf, nout, SUNTRUE, projerr, yref);
    if (check_retval(&retval, "GetSol", 1)) { return (1); }

    /* Compute solution without projection */
    retval = GetSol(cvode_mem, yy0, rtol, atol, tf, nout, SUNFALSE, SUNFALSE,
                    yref);
    if (check_retval(&retval, "GetSol", 1)) { return (1); }

    /* Reduce tolerance for next run */
    rtol /= SUN_RCONST(10.0);
    atol /= SUN_RCONST(10.0);
  }

  /* Free memory */
  N_VDestroy_Serial(yref);
  N_VDestroy_Serial(yy0);
  SUNMatDestroy(A);
  SUNLinSolFree(LS);
  CVodeFree(&cvode_mem);
  SUNContext_Free(&sunctx);

  return (0);
}